

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setEditText(QComboBox *this,QString *text)

{
  QComboBoxPrivate *this_00;
  QString *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QAccessibleValueChangeEvent event;
  QString *in_stack_ffffffffffffff68;
  QVariant *this_01;
  QLineEdit *in_stack_ffffffffffffff70;
  QAccessibleValueChangeEvent *this_02;
  QVariant local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QComboBox *)0x539295);
  if (this_00->lineEdit != (QLineEdit *)0x0) {
    QLineEdit::setText(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = &local_68;
  ::QVariant::QVariant(this_01,in_RSI);
  this_02 = (QAccessibleValueChangeEvent *)&local_48;
  QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)this_00,in_RDI,(QVariant *)this_02);
  ::QVariant::~QVariant(this_01);
  QAccessible::updateAccessibility((QAccessibleEvent *)this_02);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setEditText(const QString &text)
{
    Q_D(QComboBox);
    if (d->lineEdit)
        d->lineEdit->setText(text);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(this, text);
    QAccessible::updateAccessibility(&event);
#endif
}